

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O2

_Bool tree_iterator_nextn(void *Iterator,size_t count)

{
  void *Node;
  bool bVar1;
  
  Node = *(void **)((long)Iterator + 8);
  while( true ) {
    bVar1 = count == 0;
    count = count - 1;
    if ((Node == (void *)0x0) || (bVar1)) break;
    Node = tree_node_next(Node);
    *(void **)((long)Iterator + 8) = Node;
  }
  return Node != (void *)0x0;
}

Assistant:

bool
tree_iterator_nextn(void* Iterator, size_t count)
{
    tree_iterator* iterator = Iterator;
    while (iterator->node && count--)
	iterator->node = tree_node_next(iterator->node);
    return iterator->node != NULL;
}